

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  byte bVar9;
  char *pcVar10;
  byte *pbVar11;
  char *pcVar12;
  
  if (end <= ptr) {
    return -4;
  }
  uVar7 = (long)end - (long)ptr;
  pcVar10 = ptr + (uVar7 & 0xfffffffffffffffe);
  if ((uVar7 & 0xfffffffffffffffe) == 0) {
    pcVar10 = end;
  }
  if ((uVar7 & 1) == 0) {
    pcVar10 = end;
  }
  if (uVar7 == 1) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 - 0xd8 < 4) {
switchD_004914e9_caseD_7:
    if ((long)pcVar10 - (long)ptr < 4) {
      return -2;
    }
    goto switchD_004914e9_caseD_3;
  }
  if (bVar1 - 0xdc < 4) goto switchD_004914e9_caseD_3;
  iVar8 = 0x12;
  if (bVar1 != 0) {
    if ((bVar1 != 0xff) || ((byte)ptr[1] < 0xfe)) goto switchD_004914e9_caseD_1d;
    goto switchD_004914e9_caseD_3;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1])) {
  case 2:
    pbVar11 = (byte *)(ptr + 2);
    if ((long)pcVar10 - (long)pbVar11 < 2) {
      return -1;
    }
    bVar1 = *pbVar11;
    if (3 < bVar1 - 0xdc) {
      if (bVar1 == 0) {
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
        switch(bVar1) {
        case 0xf:
          iVar8 = big2_scanPi(enc,ptr + 4,pcVar10,nextTokPtr);
          return iVar8;
        case 0x10:
          pbVar11 = (byte *)(ptr + 4);
          if ((long)pcVar10 - (long)pbVar11 < 2) {
            return -1;
          }
          if (*pbVar11 == 0) {
            switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[5])) {
            case 0x14:
              *nextTokPtr = ptr + 6;
              return 0x21;
            case 0x16:
            case 0x18:
              pcVar12 = ptr + 6;
              pcVar10 = pcVar10 + (-6 - (long)ptr);
LAB_00491b51:
              if ((long)pcVar10 < 2) {
                return -1;
              }
              ptr = pcVar12;
              if (*pcVar12 != '\0') goto switchD_004914e9_caseD_3;
              bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)pcVar12[1]);
              switch(bVar1) {
              case 0x15:
                break;
              case 0x16:
              case 0x18:
                goto switchD_00491b81_caseD_16;
              case 0x17:
              case 0x19:
              case 0x1a:
              case 0x1b:
              case 0x1c:
              case 0x1d:
                goto switchD_004914e9_caseD_3;
              case 0x1e:
                if (pcVar10 < (char *)0x4) {
                  return -1;
                }
                if (((pcVar12[2] == '\0') &&
                    (uVar4 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)pcVar12[3]),
                    uVar4 < 0x1f)) && ((0x40200600U >> (uVar4 & 0x1f) & 1) != 0))
                goto switchD_004914e9_caseD_3;
                break;
              default:
                if (1 < bVar1 - 9) goto switchD_004914e9_caseD_3;
              }
              *nextTokPtr = pcVar12;
              return 0x10;
            case 0x1b:
              iVar8 = big2_scanComment(enc,ptr + 6,pcVar10,nextTokPtr);
              return iVar8;
            }
          }
          break;
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x15:
        case 0x17:
          break;
        case 0x16:
        case 0x18:
switchD_00491a8b_caseD_16:
          *nextTokPtr = ptr;
          return 0x1d;
        default:
          if ((bVar1 - 5 < 3) || (bVar1 == 0x1d)) goto switchD_00491a8b_caseD_16;
        }
      }
      else if ((bVar1 != 0xff) || ((byte)ptr[3] < 0xfe)) goto switchD_00491a8b_caseD_16;
    }
    *nextTokPtr = (char *)pbVar11;
    goto LAB_00491611;
  default:
    goto switchD_004914e9_caseD_3;
  case 4:
    pcVar12 = ptr + 2;
    if ((long)pcVar10 - (long)pcVar12 < 2) {
      iVar8 = -0x1a;
    }
    else {
      if ((*pcVar12 == '\0') && (ptr[3] == ']')) {
        if ((ulong)((long)pcVar10 - (long)pcVar12) < 4) {
          return -1;
        }
        if ((ptr[4] == '\0') && (ptr[5] == '>')) {
          *nextTokPtr = ptr + 6;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar12;
      iVar8 = 0x1a;
    }
    break;
  case 5:
    if ((long)pcVar10 - (long)ptr < 2) {
      return -2;
    }
    goto switchD_004914e9_caseD_3;
  case 6:
    if ((long)pcVar10 - (long)ptr < 3) {
      return -2;
    }
    goto switchD_004914e9_caseD_3;
  case 7:
    goto switchD_004914e9_caseD_7;
  case 9:
    if (ptr + 2 == pcVar10) {
      *nextTokPtr = pcVar10;
      return -0xf;
    }
  case 10:
  case 0x15:
    lVar5 = (long)pcVar10 - (long)ptr;
    do {
      pcVar12 = ptr;
      ptr = pcVar12 + 2;
      lVar5 = lVar5 + -2;
      if ((lVar5 < 2) || (*ptr != '\0')) break;
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar12[3]);
    } while (((cVar2 == '\x15') || (cVar2 == '\n')) || ((cVar2 == '\t' && (pcVar12 + 4 != pcVar10)))
            );
    *nextTokPtr = ptr;
    iVar8 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 2;
    iVar8 = 0x11;
    break;
  case 0xc:
    iVar8 = 0xc;
    goto LAB_004917db;
  case 0xd:
    iVar8 = 0xd;
LAB_004917db:
    iVar8 = big2_scanLit(iVar8,enc,ptr + 2,pcVar10,nextTokPtr);
    return iVar8;
  case 0x13:
    pbVar11 = (byte *)(ptr + 2);
    pcVar12 = pcVar10 + -(long)pbVar11;
    if ((long)pcVar12 < 2) {
      return -1;
    }
    bVar1 = *pbVar11;
    iVar6 = 0;
    if (bVar1 - 0xd8 < 4) {
joined_r0x00491960:
      iVar8 = iVar6;
      if (pcVar12 < (char *)0x4) {
        return -2;
      }
    }
    else {
      iVar8 = 0;
      if (3 < bVar1 - 0xdc) {
        if (bVar1 == 0) {
          bVar9 = ptr[3];
          cVar2 = *(char *)((long)enc[1].scanners + (ulong)bVar9);
          if (cVar2 == '\x06') {
            iVar8 = iVar6;
            if (pcVar12 == (char *)0x2) {
              return -2;
            }
          }
          else {
            if (cVar2 == '\a') goto joined_r0x00491960;
            if ((cVar2 == '\x16') || (cVar2 == '\x18')) goto LAB_004919a3;
            iVar8 = iVar6;
            if (cVar2 == '\x1d') goto LAB_0049196f;
          }
        }
        else {
          if (bVar1 == 0xff) {
            bVar9 = ptr[3];
            if (0xfd < bVar9) goto switchD_00491a6d_caseD_8;
          }
          else {
            bVar9 = ptr[3];
          }
LAB_0049196f:
          iVar8 = iVar6;
          if ((*(uint *)((long)namingBitmap +
                        (ulong)(bVar9 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
               >> (bVar9 & 0x1f) & 1) != 0) {
LAB_004919a3:
            pbVar11 = (byte *)(ptr + 4);
            pcVar10 = pcVar10 + (-6 - (long)ptr);
            while( true ) {
              pcVar12 = pcVar10 + 2;
              if ((long)pcVar12 < 2) {
                return -0x14;
              }
              bVar1 = *pbVar11;
              if (bVar1 == 0) break;
              if (bVar1 == 0xff) {
                uVar4 = (uint)pbVar11[1];
                iVar8 = iVar6;
                if (0xfd < pbVar11[1]) goto switchD_00491a6d_caseD_8;
              }
              else {
                if (bVar1 - 0xd8 < 4) goto switchD_00491a6d_caseD_7;
                iVar8 = iVar6;
                if (bVar1 - 0xdc < 4) goto switchD_00491a6d_caseD_8;
                uVar4 = (uint)pbVar11[1];
              }
switchD_00491a6d_caseD_1d:
              iVar8 = iVar6;
              if ((*(uint *)((long)namingBitmap +
                            (ulong)(uVar4 >> 3 & 0x1c |
                                   (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
                   (uVar4 & 0x1f) & 1) == 0) goto switchD_00491a6d_caseD_8;
switchD_00491a6d_caseD_16:
              pbVar11 = pbVar11 + 2;
              pcVar10 = pcVar10 + -2;
            }
            uVar4 = (uint)pbVar11[1];
            iVar8 = iVar6;
            switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar11[1])) {
            case 6:
              if (pcVar10 == (char *)0x0) {
                return -2;
              }
              break;
            case 7:
switchD_00491a6d_caseD_7:
              goto joined_r0x00491960;
            default:
              break;
            case 9:
            case 10:
            case 0xb:
            case 0x15:
            case 0x1e:
            case 0x20:
            case 0x24:
              iVar8 = 0x14;
              break;
            case 0x16:
            case 0x18:
            case 0x19:
            case 0x1a:
            case 0x1b:
              goto switchD_00491a6d_caseD_16;
            case 0x1d:
              goto switchD_00491a6d_caseD_1d;
            }
          }
        }
      }
    }
switchD_00491a6d_caseD_8:
    *nextTokPtr = (char *)pbVar11;
    break;
  case 0x14:
    *nextTokPtr = ptr + 2;
    iVar8 = 0x19;
    break;
  case 0x16:
  case 0x18:
switchD_004914e9_caseD_16:
    bVar3 = false;
    goto LAB_00491552;
  case 0x19:
  case 0x1a:
  case 0x1b:
switchD_004914e9_caseD_19:
    iVar8 = 0x13;
    bVar3 = true;
LAB_00491552:
    uVar7 = (long)pcVar10 - (long)ptr;
    pcVar10 = ptr + 4;
LAB_00491572:
    uVar7 = uVar7 - 2;
    if (1 < (long)uVar7) {
      bVar1 = pcVar10[-2];
      if (bVar1 != 0) {
        if (bVar1 == 0xff) {
          if ((byte)pcVar10[-1] < 0xfe) goto switchD_004915f0_caseD_1d;
        }
        else {
          if (bVar1 - 0xd8 < 4) goto switchD_004915f0_caseD_7;
          if (3 < bVar1 - 0xdc) goto switchD_004915f0_caseD_1d;
        }
        goto switchD_004915f0_caseD_5;
      }
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar10[-1])) {
      case 6:
        if (uVar7 == 2) {
          return -2;
        }
        break;
      case 7:
switchD_004915f0_caseD_7:
        if (uVar7 < 4) {
          return -2;
        }
        break;
      case 9:
      case 10:
      case 0xb:
      case 0x14:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = pcVar10 + -2;
        return iVar8;
      case 0xf:
        if (!bVar3) {
          *nextTokPtr = pcVar10;
          return 0x1e;
        }
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_004915f0_caseD_16;
      case 0x1d:
switchD_004915f0_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)pcVar10[-1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)pcVar10[-1] & 0x1f) & 1) != 0) goto switchD_004915f0_caseD_16;
        break;
      case 0x21:
        if (!bVar3) {
          *nextTokPtr = pcVar10;
          return 0x1f;
        }
        break;
      case 0x22:
        if (!bVar3) {
          *nextTokPtr = pcVar10;
          return 0x20;
        }
      }
switchD_004915f0_caseD_5:
      ptr = pcVar10 + -2;
      goto switchD_004914e9_caseD_3;
    }
    iVar8 = -iVar8;
    break;
  case 0x1d:
switchD_004914e9_caseD_1d:
    bVar9 = ptr[1];
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] * 0x20 + (uint)(bVar9 >> 5) * 4))
         >> (bVar9 & 0x1f) & 1) != 0) goto switchD_004914e9_caseD_16;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] * 0x20 +
                         (uint)(bVar9 >> 5) * 4)) & 1 << (bVar9 & 0x1f)) != 0)
    goto switchD_004914e9_caseD_19;
switchD_004914e9_caseD_3:
    *nextTokPtr = ptr;
LAB_00491611:
    iVar8 = 0;
    break;
  case 0x1e:
    iVar8 = big2_scanPercent(enc,ptr + 2,pcVar10,nextTokPtr);
    return iVar8;
  case 0x1f:
    *nextTokPtr = ptr + 2;
    iVar8 = 0x17;
    break;
  case 0x20:
    pcVar12 = ptr + 2;
    if ((long)pcVar10 - (long)pcVar12 < 2) {
      return -0x18;
    }
    if (*pcVar12 == '\0') {
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
      switch(bVar1) {
      case 0x20:
      case 0x23:
      case 0x24:
switchD_004918eb_caseD_20:
        *nextTokPtr = pcVar12;
        return 0x18;
      case 0x21:
        *nextTokPtr = ptr + 4;
        return 0x24;
      case 0x22:
        *nextTokPtr = ptr + 4;
        return 0x25;
      default:
        if (bVar1 - 9 < 3) goto switchD_004918eb_caseD_20;
      }
      if (bVar1 == 0xf) {
        *nextTokPtr = ptr + 4;
        return 0x23;
      }
      if (bVar1 == 0x15) goto switchD_004918eb_caseD_20;
    }
    *nextTokPtr = pcVar12;
    goto LAB_00491611;
  case 0x23:
    *nextTokPtr = ptr + 2;
    iVar8 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 2;
    iVar8 = 0x15;
  }
  return iVar8;
switchD_004915f0_caseD_16:
  pcVar10 = pcVar10 + 2;
  goto LAB_00491572;
switchD_00491b81_caseD_16:
  pcVar12 = pcVar12 + 2;
  pcVar10 = pcVar10 + -2;
  goto LAB_00491b51;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr)
{
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}